

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_custom_options.pb.cc
# Opt level: O3

void __thiscall proto2_unittest::Aggregate::Clear(Aggregate *this)

{
  ulong uVar1;
  Aggregate *this_00;
  FileOptions *this_01;
  AggregateMessageSet *this_02;
  Any *this_03;
  anon_union_56_1_493b367e_for_Aggregate_5 aVar2;
  undefined8 *puVar3;
  char *failure_msg;
  int line;
  char *file;
  LogMessageFatal local_20;
  
  aVar2 = this->field_0;
  if (((undefined1  [56])aVar2 & (undefined1  [56])0x1f) != (undefined1  [56])0x0) {
    if (((undefined1  [56])aVar2 & (undefined1  [56])0x1) != (undefined1  [56])0x0) {
      uVar1 = *(ulong *)((long)&this->field_0 + 8);
      if ((uVar1 & 3) == 0) {
        file = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring.h"
        ;
        failure_msg = "!tagged_ptr_.IsDefault()";
        line = 0x20b;
        goto LAB_00ccdc14;
      }
      puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
      puVar3[1] = 0;
      *(undefined1 *)*puVar3 = 0;
    }
    if (((undefined1  [56])aVar2 & (undefined1  [56])0x2) != (undefined1  [56])0x0) {
      this_00 = (this->field_0)._impl_.sub_;
      if (this_00 == (Aggregate *)0x0) {
        file = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/unittest_custom_options.pb.cc"
        ;
        failure_msg = "_impl_.sub_ != nullptr";
        line = 0x1708;
        goto LAB_00ccdc14;
      }
      Clear(this_00);
    }
    if (((undefined1  [56])aVar2 & (undefined1  [56])0x4) != (undefined1  [56])0x0) {
      this_01 = (this->field_0)._impl_.file_;
      if (this_01 == (FileOptions *)0x0) {
        file = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/unittest_custom_options.pb.cc"
        ;
        failure_msg = "_impl_.file_ != nullptr";
        line = 0x170c;
        goto LAB_00ccdc14;
      }
      google::protobuf::FileOptions::Clear(this_01);
    }
    if (((undefined1  [56])aVar2 & (undefined1  [56])0x8) != (undefined1  [56])0x0) {
      this_02 = (this->field_0)._impl_.mset_;
      if (this_02 == (AggregateMessageSet *)0x0) {
        file = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/unittest_custom_options.pb.cc"
        ;
        failure_msg = "_impl_.mset_ != nullptr";
        line = 0x1710;
        goto LAB_00ccdc14;
      }
      AggregateMessageSet::Clear(this_02);
    }
    if (((undefined1  [56])aVar2 & (undefined1  [56])0x10) != (undefined1  [56])0x0) {
      this_03 = (this->field_0)._impl_.any_;
      if (this_03 == (Any *)0x0) {
        file = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/unittest_custom_options.pb.cc"
        ;
        failure_msg = "_impl_.any_ != nullptr";
        line = 0x1714;
LAB_00ccdc14:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_20,file,line,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
      }
      google::protobuf::Any::Clear(this_03);
    }
  }
  (this->field_0)._impl_.i_ = 0;
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void Aggregate::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.Aggregate)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000001fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _impl_.s_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(_impl_.sub_ != nullptr);
      _impl_.sub_->Clear();
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      ABSL_DCHECK(_impl_.file_ != nullptr);
      _impl_.file_->Clear();
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      ABSL_DCHECK(_impl_.mset_ != nullptr);
      _impl_.mset_->Clear();
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      ABSL_DCHECK(_impl_.any_ != nullptr);
      _impl_.any_->Clear();
    }
  }
  _impl_.i_ = 0;
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}